

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int __thiscall QDockAreaLayoutInfo::tabIndexToListIndex(QDockAreaLayoutInfo *this,int tabIndex)

{
  unsigned_long_long uVar1;
  qsizetype qVar2;
  quintptr qVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  quintptr data;
  QDockAreaLayoutItem *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QTabBar *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTabBar::tabData(in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20));
  uVar1 = qvariant_cast<unsigned_long_long>
                    ((QVariant *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  ::QVariant::~QVariant(&local_28);
  local_4c = 0;
  do {
    qVar2 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 0x40));
    if (qVar2 <= local_4c) {
      local_2c = -1;
LAB_0057692e:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_2c;
      }
      __stack_chk_fail();
    }
    QList<QDockAreaLayoutItem>::at
              ((QList<QDockAreaLayoutItem> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (qsizetype)in_stack_ffffffffffffff88);
    qVar3 = tabId(in_stack_ffffffffffffff88);
    if (qVar3 == uVar1) {
      local_2c = local_4c;
      goto LAB_0057692e;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int QDockAreaLayoutInfo::tabIndexToListIndex(int tabIndex) const
{
    Q_ASSERT(tabbed && tabBar);
    quintptr data = qvariant_cast<quintptr>(tabBar->tabData(tabIndex));
    for (int i = 0; i < item_list.size(); ++i) {
        if (tabId(item_list.at(i)) == data)
            return i;
    }
    return -1;
}